

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::Segment::AddFrameWithDiscardPadding
          (Segment *this,uint8_t *data,uint64_t length,int64_t discard_padding,uint64_t track_number
          ,uint64_t timestamp,bool is_key)

{
  bool bVar1;
  Frame frame;
  Frame local_98;
  
  if (data == (uint8_t *)0x0) {
    bVar1 = false;
  }
  else {
    Frame::Frame(&local_98);
    bVar1 = Frame::Init(&local_98,data,length);
    if (bVar1) {
      local_98.is_key_ = is_key;
      local_98.track_number_ = track_number;
      local_98.timestamp_ = timestamp;
      local_98.discard_padding_ = discard_padding;
      bVar1 = AddGenericFrame(this,&local_98);
    }
    else {
      bVar1 = false;
    }
    Frame::~Frame(&local_98);
  }
  return bVar1;
}

Assistant:

bool Segment::AddFrameWithDiscardPadding(const uint8_t* data, uint64_t length,
                                         int64_t discard_padding,
                                         uint64_t track_number,
                                         uint64_t timestamp, bool is_key) {
  if (!data)
    return false;

  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_discard_padding(discard_padding);
  frame.set_track_number(track_number);
  frame.set_timestamp(timestamp);
  frame.set_is_key(is_key);
  return AddGenericFrame(&frame);
}